

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

LongNameHandler *
icu_63::number::impl::LongNameHandler::forCompoundUnit
          (Locale *loc,MeasureUnit *unit,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  undefined8 this;
  UBool UVar1;
  LongNameHandler *this_00;
  UnicodeString *that;
  UnicodeString *local_7a8;
  UnicodeString *local_778;
  UnicodeString *local_718;
  UnicodeString *local_6e0;
  LongNameHandler *local_6d0;
  UnicodeString local_6c8;
  UnicodeString local_688;
  UnicodeString local_648;
  undefined1 local_608 [8];
  UnicodeString secondaryString;
  SimpleFormatter secondaryCompiled;
  UnicodeString secondaryFormat;
  SimpleFormatter compiled;
  UnicodeString rawPerUnitFormat;
  UnicodeString perUnitFormat;
  UnicodeString local_2b8;
  undefined1 auStack_278 [528];
  undefined1 auStack_68 [40];
  LongNameHandler *result;
  MicroPropsGenerator *parent_local;
  PluralRules *rules_local;
  UNumberUnitWidth *width_local;
  MeasureUnit *perUnit_local;
  MeasureUnit *unit_local;
  Locale *loc_local;
  
  result = (LongNameHandler *)parent;
  parent_local = (MicroPropsGenerator *)rules;
  rules_local = (PluralRules *)width;
  width_local = (UNumberUnitWidth *)perUnit;
  perUnit_local = unit;
  unit_local = (MeasureUnit *)loc;
  this_00 = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)unit);
  auStack_68[0x1f] = 0;
  local_6d0 = (LongNameHandler *)0x0;
  if (this_00 != (LongNameHandler *)0x0) {
    auStack_68[0x1f] = 1;
    LongNameHandler(this_00,(PluralRules *)parent_local,&result->super_MicroPropsGenerator);
    local_6d0 = this_00;
  }
  auStack_68._32_8_ = local_6d0;
  if (local_6d0 == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return (LongNameHandler *)0x0;
  }
  local_6e0 = (UnicodeString *)(auStack_278 + 0x10);
  do {
    UnicodeString::UnicodeString(local_6e0);
    local_6e0 = local_6e0 + 1;
  } while (local_6e0 != (UnicodeString *)auStack_68);
  anon_unknown.dwarf_13ccb4::getMeasureData
            ((Locale *)unit_local,perUnit_local,(UNumberUnitWidth *)rules_local,
             (UnicodeString *)(auStack_278 + 0x10),status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    loc_local = (Locale *)auStack_68._32_8_;
    auStack_278._12_4_ = 1;
    goto LAB_002e29f4;
  }
  local_718 = (UnicodeString *)((long)&perUnitFormat.fUnion + 0x30);
  do {
    UnicodeString::UnicodeString(local_718);
    local_718 = local_718 + 1;
  } while (local_718 != (UnicodeString *)auStack_278);
  anon_unknown.dwarf_13ccb4::getMeasureData
            ((Locale *)unit_local,(MeasureUnit *)width_local,(UNumberUnitWidth *)rules_local,
             (UnicodeString *)((long)&perUnitFormat.fUnion + 0x30),status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString((UnicodeString *)((long)&rawPerUnitFormat.fUnion + 0x30));
    UVar1 = UnicodeString::isBogus(&local_2b8);
    if (UVar1 == '\0') {
      UnicodeString::operator=((UnicodeString *)((long)&rawPerUnitFormat.fUnion + 0x30),&local_2b8);
LAB_002e28af:
      this = auStack_68._32_8_;
      UnicodeString::UnicodeString
                (&local_6c8,(UnicodeString *)((long)&rawPerUnitFormat.fUnion + 0x30));
      multiSimpleFormatsToModifiers
                ((LongNameHandler *)this,(UnicodeString *)(auStack_278 + 0x10),&local_6c8,
                 UNUM_FIELD_COUNT,status);
      UnicodeString::~UnicodeString(&local_6c8);
      loc_local = (Locale *)auStack_68._32_8_;
      auStack_278._12_4_ = 1;
    }
    else {
      anon_unknown.dwarf_13ccb4::getPerUnitFormat
                ((UnicodeString *)((long)&compiled.compiledPattern.fUnion + 0x30),
                 (Locale *)unit_local,(UNumberUnitWidth *)rules_local,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        SimpleFormatter::SimpleFormatter
                  ((SimpleFormatter *)((long)&secondaryFormat.fUnion + 0x30),
                   (UnicodeString *)((long)&compiled.compiledPattern.fUnion + 0x30),2,2,status);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 == '\0') {
          anon_unknown.dwarf_13ccb4::getWithPlural
                    ((UnicodeString *)((long)&secondaryCompiled.compiledPattern.fUnion + 0x30),
                     (UnicodeString *)((long)&perUnitFormat.fUnion + 0x30),ONE,status);
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 == '\0') {
            SimpleFormatter::SimpleFormatter
                      ((SimpleFormatter *)((long)&secondaryString.fUnion + 0x30),
                       (UnicodeString *)((long)&secondaryCompiled.compiledPattern.fUnion + 0x30),1,1
                       ,status);
            UVar1 = ::U_FAILURE(*status);
            if (UVar1 == '\0') {
              SimpleFormatter::getTextWithNoArguments
                        (&local_648,(SimpleFormatter *)((long)&secondaryString.fUnion + 0x30));
              that = UnicodeString::trim(&local_648);
              UnicodeString::UnicodeString((UnicodeString *)local_608,that);
              UnicodeString::~UnicodeString(&local_648);
              UnicodeString::UnicodeString(&local_688,L"{0}");
              SimpleFormatter::format
                        ((SimpleFormatter *)((long)&secondaryFormat.fUnion + 0x30),&local_688,
                         (UnicodeString *)local_608,
                         (UnicodeString *)((long)&rawPerUnitFormat.fUnion + 0x30),status);
              UnicodeString::~UnicodeString(&local_688);
              UVar1 = ::U_FAILURE(*status);
              if (UVar1 != '\0') {
                loc_local = (Locale *)auStack_68._32_8_;
              }
              auStack_278._13_3_ = 0;
              auStack_278[0xc] = UVar1 != '\0';
              UnicodeString::~UnicodeString((UnicodeString *)local_608);
            }
            else {
              loc_local = (Locale *)auStack_68._32_8_;
              auStack_278._12_4_ = 1;
            }
            SimpleFormatter::~SimpleFormatter
                      ((SimpleFormatter *)((long)&secondaryString.fUnion + 0x30));
          }
          else {
            loc_local = (Locale *)auStack_68._32_8_;
            auStack_278._12_4_ = 1;
          }
          UnicodeString::~UnicodeString
                    ((UnicodeString *)((long)&secondaryCompiled.compiledPattern.fUnion + 0x30));
        }
        else {
          loc_local = (Locale *)auStack_68._32_8_;
          auStack_278._12_4_ = 1;
        }
        SimpleFormatter::~SimpleFormatter((SimpleFormatter *)((long)&secondaryFormat.fUnion + 0x30))
        ;
      }
      else {
        loc_local = (Locale *)auStack_68._32_8_;
        auStack_278._12_4_ = 1;
      }
      UnicodeString::~UnicodeString
                ((UnicodeString *)((long)&compiled.compiledPattern.fUnion + 0x30));
      if (auStack_278._12_4_ == 0) goto LAB_002e28af;
    }
    UnicodeString::~UnicodeString((UnicodeString *)((long)&rawPerUnitFormat.fUnion + 0x30));
  }
  else {
    loc_local = (Locale *)auStack_68._32_8_;
    auStack_278._12_4_ = 1;
  }
  local_778 = (UnicodeString *)auStack_278;
  do {
    local_778 = local_778 + -1;
    UnicodeString::~UnicodeString(local_778);
  } while (local_778 != (UnicodeString *)((long)&perUnitFormat.fUnion + 0x30));
LAB_002e29f4:
  local_7a8 = (UnicodeString *)auStack_68;
  do {
    local_7a8 = local_7a8 + -1;
    UnicodeString::~UnicodeString(local_7a8);
  } while (local_7a8 != (UnicodeString *)(auStack_278 + 0x10));
  return (LongNameHandler *)loc_local;
}

Assistant:

LongNameHandler*
LongNameHandler::forCompoundUnit(const Locale &loc, const MeasureUnit &unit, const MeasureUnit &perUnit,
                                 const UNumberUnitWidth &width, const PluralRules *rules,
                                 const MicroPropsGenerator *parent, UErrorCode &status) {
    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString primaryData[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, primaryData, status);
    if (U_FAILURE(status)) { return result; }
    UnicodeString secondaryData[ARRAY_LENGTH];
    getMeasureData(loc, perUnit, width, secondaryData, status);
    if (U_FAILURE(status)) { return result; }

    UnicodeString perUnitFormat;
    if (!secondaryData[PER_INDEX].isBogus()) {
        perUnitFormat = secondaryData[PER_INDEX];
    } else {
        UnicodeString rawPerUnitFormat = getPerUnitFormat(loc, width, status);
        if (U_FAILURE(status)) { return result; }
        // rawPerUnitFormat is something like "{0}/{1}"; we need to substitute in the secondary unit.
        SimpleFormatter compiled(rawPerUnitFormat, 2, 2, status);
        if (U_FAILURE(status)) { return result; }
        UnicodeString secondaryFormat = getWithPlural(secondaryData, StandardPlural::Form::ONE, status);
        if (U_FAILURE(status)) { return result; }
        SimpleFormatter secondaryCompiled(secondaryFormat, 1, 1, status);
        if (U_FAILURE(status)) { return result; }
        UnicodeString secondaryString = secondaryCompiled.getTextWithNoArguments().trim();
        // TODO: Why does UnicodeString need to be explicit in the following line?
        compiled.format(UnicodeString(u"{0}"), secondaryString, perUnitFormat, status);
        if (U_FAILURE(status)) { return result; }
    }
    // TODO: What field to use for units?
    result->multiSimpleFormatsToModifiers(primaryData, perUnitFormat, UNUM_FIELD_COUNT, status);
    return result;
}